

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testCopyMultiPartFile.cpp
# Opt level: O3

bool __thiscall
anon_unknown.dwarf_e60ea::checkPixels<Imath_3_2::half>
          (anon_unknown_dwarf_e60ea *this,Array2D<unsigned_int> *sampleCount,
          Array2D<Imath_3_2::half_*> *ph,int width,int height)

{
  uint uVar1;
  char cVar2;
  ostream *poVar3;
  long *plVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  float fVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  int iVar12;
  ulong uVar13;
  bool bVar14;
  float fVar15;
  
  if (0 < height) {
    uVar13 = 0;
    bVar14 = false;
    do {
      if (0 < width) {
        uVar11 = 0;
        do {
          uVar10 = (ulong)*(uint *)((long)&sampleCount->_sizeX +
                                   uVar11 * 4 + uVar13 * (long)this * 4);
          if (uVar10 != 0) {
            iVar12 = ((int)uVar11 + (int)uVar13 * width) % 0x801;
            fVar15 = (float)iVar12;
            uVar6 = (uint)fVar15 & 0x7fffff | 0x800000;
            cVar2 = (char)((uint)fVar15 >> 0x17);
            fVar8 = ABS(fVar15);
            uVar5 = (uint)fVar15 >> 0x10 & 0x8000;
            uVar9 = (uint)fVar15 >> 0xd & 0x3ff;
            uVar1 = uVar5 + 0x7c00;
            if ((uint)fVar8 < 0x477ff000) {
              uVar1 = (int)fVar8 + 0x8000fff + (uint)(((uint)fVar8 >> 0xd & 1) != 0) >> 0xd | uVar5;
            }
            uVar9 = uVar9 == 0 | uVar9;
            if (fVar8 == INFINITY) {
              uVar9 = 0;
            }
            uVar9 = uVar5 + 0x7c00 + uVar9;
            if ((uint)fVar8 < 0x7f800000) {
              uVar9 = uVar1;
            }
            uVar1 = (uint)(0x80000000 < uVar6 << (cVar2 + 0xa2U & 0x1f)) +
                    (uVar6 >> (0x7eU - cVar2 & 0x1f) | uVar5);
            if ((uint)fVar8 < 0x33000001) {
              uVar1 = uVar5;
            }
            if (0x387fffff < (uint)fVar8) {
              uVar1 = uVar9;
            }
            fVar8 = *(float *)(_imath_half_to_float_table + ((ulong)uVar1 & 0xffff) * 4);
            uVar7 = 0;
            do {
              fVar15 = *(float *)(_imath_half_to_float_table +
                                 (ulong)ph->_data[uVar13 * ph->_sizeY + uVar11][uVar7]._h * 4);
              if ((fVar15 != fVar8) || (NAN(fVar15) || NAN(fVar8))) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"value at ",9);
                poVar3 = (ostream *)std::ostream::operator<<(&std::cout,(int)uVar11);
                std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
                poVar3 = (ostream *)std::ostream::operator<<(poVar3,(int)uVar13);
                std::__ostream_insert<char,std::char_traits<char>>(poVar3,", sample ",9);
                poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
                std::__ostream_insert<char,std::char_traits<char>>(poVar3,": ",2);
                poVar3 = (ostream *)
                         ::operator<<(poVar3,(half)ph->_data[uVar13 * ph->_sizeY + uVar11][uVar7]._h
                                     );
                std::__ostream_insert<char,std::char_traits<char>>(poVar3,", should be ",0xc);
                plVar4 = (long *)std::ostream::operator<<(poVar3,iVar12);
                std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
                std::ostream::put((char)plVar4);
                std::ostream::flush();
                std::ostream::flush();
                return bVar14;
              }
              uVar7 = uVar7 + 1;
            } while (uVar10 != uVar7);
          }
          uVar11 = uVar11 + 1;
        } while (uVar11 != (uint)width);
      }
      bVar14 = height - 1 <= uVar13;
      uVar13 = uVar13 + 1;
    } while (uVar13 != (uint)height);
  }
  return true;
}

Assistant:

bool
checkPixels (
    Array2D<unsigned int>& sampleCount, Array2D<T*>& ph, int width, int height)
{
    return checkPixels<T> (sampleCount, ph, 0, width - 1, 0, height - 1, width);
}